

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetC.c
# Opt level: O0

void point_mul_two(uchar *outx,uchar *outy,uchar *a,uchar *b,uchar *inx,uchar *iny)

{
  pt_aff_t_conflict3 P;
  uint64_t *in_stack_00000208;
  uint8_t *in_stack_00000210;
  uint8_t *in_stack_00000280;
  uint64_t *in_stack_00000288;
  uint64_t *in_stack_00000488;
  uint64_t *in_stack_00000490;
  uint64_t *in_stack_000004f8;
  uint64_t *in_stack_00000500;
  pt_aff_t_conflict3 *in_stack_00001038;
  uchar *in_stack_00001040;
  uchar *in_stack_00001048;
  pt_aff_t_conflict3 *in_stack_00001050;
  
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(in_stack_00000288,in_stack_00000280);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_bytes(in_stack_00000288,in_stack_00000280);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(in_stack_00000500,in_stack_000004f8);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_montgomery(in_stack_00000500,in_stack_000004f8);
  var_smul_wnaf_two(in_stack_00001050,in_stack_00001048,in_stack_00001040,in_stack_00001038);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(in_stack_00000490,in_stack_00000488);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_from_montgomery(in_stack_00000490,in_stack_00000488);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(in_stack_00000210,in_stack_00000208);
  fiat_id_tc26_gost_3410_2012_512_paramSetB_to_bytes(in_stack_00000210,in_stack_00000208);
  return;
}

Assistant:

static void point_mul_two(unsigned char outx[64], unsigned char outy[64],
                          const unsigned char a[64], const unsigned char b[64],
                          const unsigned char inx[64],
                          const unsigned char iny[64]) {
    pt_aff_t P;

    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(P.X, inx);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_from_bytes(P.Y, iny);
    /* simultaneous scalar multiplication */
    var_smul_wnaf_two(&P, a, b, &P);

    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(outx, P.X);
    fiat_id_tc26_gost_3410_2012_512_paramSetC_to_bytes(outy, P.Y);
}